

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  U32 UVar1;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    if (optLevel == 0) {
      UVar1 = ZSTD_bitWeight(optPtr->litSum);
    }
    else {
      UVar1 = ZSTD_fracWeight(optPtr->litSum);
    }
    optPtr->litSumBasePrice = UVar1;
  }
  if (optLevel == 0) {
    UVar1 = ZSTD_bitWeight(optPtr->litLengthSum);
    optPtr->litLengthSumBasePrice = UVar1;
    UVar1 = ZSTD_bitWeight(optPtr->matchLengthSum);
    optPtr->matchLengthSumBasePrice = UVar1;
    UVar1 = ZSTD_bitWeight(optPtr->offCodeSum);
  }
  else {
    UVar1 = ZSTD_fracWeight(optPtr->litLengthSum);
    optPtr->litLengthSumBasePrice = UVar1;
    UVar1 = ZSTD_fracWeight(optPtr->matchLengthSum);
    optPtr->matchLengthSumBasePrice = UVar1;
    UVar1 = ZSTD_fracWeight(optPtr->offCodeSum);
  }
  optPtr->offCodeSumBasePrice = UVar1;
  return;
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}